

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

value YAML::GetStringEscapingStyle(EMITTER_MANIP emitterManip)

{
  EMITTER_MANIP emitterManip_local;
  undefined4 local_4;
  
  if (emitterManip == EscapeNonAscii) {
    local_4 = NonAscii;
  }
  else if (emitterManip == EscapeAsJson) {
    local_4 = JSON;
  }
  else {
    local_4 = None;
  }
  return local_4;
}

Assistant:

StringEscaping::value GetStringEscapingStyle(const EMITTER_MANIP emitterManip) {
  switch (emitterManip) {
    case EscapeNonAscii:
      return StringEscaping::NonAscii;
    case EscapeAsJson:
      return StringEscaping::JSON;
    default:
      return StringEscaping::None;
      break;
  }
}